

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

TPZFMatrix<long> * __thiscall TPZFMatrix<long>::operator=(TPZFMatrix<long> *this,TPZMatrix<long> *A)

{
  int iVar1;
  long *plVar2;
  undefined4 extraout_var;
  long lVar3;
  int64_t c;
  long lVar4;
  int64_t r;
  long lVar5;
  ulong uVar6;
  
  lVar3 = (A->super_TPZBaseMatrix).fRow;
  lVar5 = (A->super_TPZBaseMatrix).fCol;
  uVar6 = lVar5 * lVar3;
  plVar2 = this->fElem;
  if (plVar2 != this->fGiven) {
    if (plVar2 != (long *)0x0) {
      operator_delete__(plVar2);
    }
    this->fElem = (long *)0x0;
  }
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow = lVar3;
  (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol = lVar5;
  if (this->fSize < (long)uVar6) {
    plVar2 = (long *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
  }
  else {
    plVar2 = this->fGiven;
  }
  this->fElem = plVar2;
  for (lVar4 = 0; lVar4 < lVar5; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 < lVar3; lVar5 = lVar5 + 1) {
      iVar1 = (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(A,lVar5,lVar4);
      *plVar2 = CONCAT44(extraout_var,iVar1);
      plVar2 = plVar2 + 1;
      lVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    }
    lVar5 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator=(const TPZMatrix<TVar> &A ) {
    int64_t arows  = A.Rows();
    int64_t acols  = A.Cols();
    int64_t size = arows * acols;
    if(fElem != fGiven) {
        delete []fElem;
        fElem = 0;
    }
    this->fRow  =  arows;
    this->fCol  = acols;
    if(fSize < size) {
        fElem = new TVar[ arows * acols ] ;
    } else {
        fElem = fGiven;
    }
    TVar * dst = fElem;
    for ( int64_t c = 0; c < this->fCol; c++ )
        for ( int64_t r = 0; r < this->fRow; r++ )
            *dst++ = A.Get( r, c );
    return( *this );
}